

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

wchar_t player_apply_damage_reduction(player *p,wchar_t dam)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  if ((dam < L'⌨') && (p->timed[0xc] != 0)) {
    return L'\0';
  }
  wVar2 = (p->state).dam_red;
  wVar3 = dam - wVar2;
  if ((wVar3 != L'\0' && wVar2 <= dam) && (wVar2 = (p->state).perc_dam_red, wVar2 != L'\0')) {
    iVar1 = (int)((ulong)((long)(wVar2 * wVar3) * -0x51eb851f) >> 0x20);
    wVar3 = ((iVar1 >> 5) - (iVar1 >> 0x1f)) + wVar3;
  }
  wVar2 = L'\0';
  if (L'\0' < wVar3) {
    wVar2 = wVar3;
  }
  return wVar2;
}

Assistant:

int player_apply_damage_reduction(struct player *p, int dam)
{
	/* Mega-Hack -- Apply "invulnerability" */
	if (p->timed[TMD_INVULN] && (dam < 9000)) return 0;

	dam -= p->state.dam_red;
	if (dam > 0 && p->state.perc_dam_red) {
		dam -= (dam * p->state.perc_dam_red) / 100 ;
	}

	return (dam < 0) ? 0 : dam;
}